

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvim.cpp
# Opt level: O3

void __thiscall nvim::Nvim::err_write(Nvim *this,string *str)

{
  string local_68;
  variant<_cf2d41c5_> local_48;
  
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"nvim_err_write","");
  NvimRPC::do_call<std::__cxx11::string>((Object *)&local_48,&this->client_,&local_68,str);
  boost::variant<$cf2d41c5$>::destroy_content(&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void Nvim::err_write(const std::string& str) {
    client_.call("nvim_err_write", nullptr, str);
}